

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzer.cpp
# Opt level: O0

void __thiscall I2sAnalyzer::I2sAnalyzer(I2sAnalyzer *this)

{
  I2sAnalyzerSettings *this_00;
  I2sAnalyzer *this_local;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__I2sAnalyzer_00116ca0;
  this_00 = (I2sAnalyzerSettings *)operator_new(0xb8);
  I2sAnalyzerSettings::I2sAnalyzerSettings(this_00);
  std::auto_ptr<I2sAnalyzerSettings>::auto_ptr(&this->mSettings,this_00);
  std::auto_ptr<I2sAnalyzerResults>::auto_ptr(&this->mResults,(element_type *)0x0);
  this->mSimulationInitilized = false;
  I2sSimulationDataGenerator::I2sSimulationDataGenerator(&this->mSimulationDataGenerator);
  std::vector<BitState,_std::allocator<BitState>_>::vector(&this->mDataBits);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (&this->mDataValidEdges);
  std::auto_ptr<I2sAnalyzerSettings>::get(&this->mSettings);
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  Analyzer::UseFrameV2();
  return;
}

Assistant:

I2sAnalyzer::I2sAnalyzer() : Analyzer2(), mSettings( new I2sAnalyzerSettings() ), mSimulationInitilized( false )
{
    SetAnalyzerSettings( mSettings.get() );
    UseFrameV2();
}